

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::ObjectIntersector1<true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Scene *pSVar3;
  bool bVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  AABBNodeMB4D *node1;
  ulong uVar13;
  _func_int **pp_Var14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong unaff_R12;
  size_t mask;
  ulong uVar20;
  ulong uVar21;
  byte bVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  float fVar35;
  undefined1 auVar36 [64];
  undefined4 uVar37;
  undefined8 uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  float fVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 in_ZMM18 [64];
  int mask_1;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_2504;
  RayQueryContext *local_2500;
  ulong local_24f8;
  ulong local_24f0;
  ulong local_24e8;
  ulong local_24e0;
  ulong local_24d8;
  ulong local_24d0;
  ulong *local_24c8;
  RTCIntersectFunctionNArguments local_24c0;
  Geometry *local_2490;
  undefined8 local_2488;
  RTCIntersectArguments *local_2480;
  undefined1 local_2478 [32];
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2370[0] = 0;
    if (local_2378 != 8) {
      aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
      auVar6 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3])
                         );
      auVar7 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar24._8_4_ = 0x7fffffff;
      auVar24._0_8_ = 0x7fffffff7fffffff;
      auVar24._12_4_ = 0x7fffffff;
      auVar24 = vandps_avx512vl((undefined1  [16])aVar2,auVar24);
      auVar39._8_4_ = 0x219392ef;
      auVar39._0_8_ = 0x219392ef219392ef;
      auVar39._12_4_ = 0x219392ef;
      local_24c8 = local_2368;
      uVar16 = vcmpps_avx512vl(auVar24,auVar39,1);
      bVar4 = (bool)((byte)uVar16 & 1);
      auVar25._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)aVar2.x;
      bVar4 = (bool)((byte)(uVar16 >> 1) & 1);
      auVar25._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)aVar2.y;
      bVar4 = (bool)((byte)(uVar16 >> 2) & 1);
      auVar25._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)aVar2.z;
      bVar4 = (bool)((byte)(uVar16 >> 3) & 1);
      auVar25._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * aVar2.field_3.a;
      auVar24 = vrcp14ps_avx512vl(auVar25);
      auVar26._8_4_ = 0x3f800000;
      auVar26._0_8_ = &DAT_3f8000003f800000;
      auVar26._12_4_ = 0x3f800000;
      auVar26 = vfnmadd213ps_avx512vl(auVar25,auVar24,auVar26);
      auVar25 = vfmadd132ps_fma(auVar26,auVar24,auVar24);
      fVar35 = auVar25._0_4_;
      local_23b8._4_4_ = fVar35;
      local_23b8._0_4_ = fVar35;
      local_23b8._8_4_ = fVar35;
      local_23b8._12_4_ = fVar35;
      local_23b8._16_4_ = fVar35;
      local_23b8._20_4_ = fVar35;
      local_23b8._24_4_ = fVar35;
      local_23b8._28_4_ = fVar35;
      auVar45 = ZEXT3264(local_23b8);
      auVar24 = vmovshdup_avx(auVar25);
      uVar38 = auVar24._0_8_;
      local_23d8._8_8_ = uVar38;
      local_23d8._0_8_ = uVar38;
      local_23d8._16_8_ = uVar38;
      local_23d8._24_8_ = uVar38;
      auVar46 = ZEXT3264(local_23d8);
      auVar26 = vshufpd_avx(auVar25,auVar25,1);
      auVar40._8_4_ = 2;
      auVar40._0_8_ = 0x200000002;
      auVar40._12_4_ = 2;
      auVar40._16_4_ = 2;
      auVar40._20_4_ = 2;
      auVar40._24_4_ = 2;
      auVar40._28_4_ = 2;
      fVar41 = fVar35 * (ray->super_RayK<1>).org.field_0.m128[0];
      local_23f8 = vpermps_avx2(auVar40,ZEXT1632(auVar25));
      auVar47 = ZEXT3264(local_23f8);
      auVar27._8_4_ = 1;
      auVar27._0_8_ = 0x100000001;
      auVar27._12_4_ = 1;
      auVar27._16_4_ = 1;
      auVar27._20_4_ = 1;
      auVar27._24_4_ = 1;
      auVar27._28_4_ = 1;
      auVar42 = ZEXT1632(CONCAT412(auVar25._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                   CONCAT48(auVar25._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2]
                                            ,CONCAT44(auVar25._4_4_ *
                                                      (ray->super_RayK<1>).org.field_0.m128[1],
                                                      fVar41))));
      auVar27 = vpermps_avx2(auVar27,auVar42);
      auVar40 = vpermps_avx2(auVar40,auVar42);
      local_24d0 = (ulong)(fVar35 < 0.0) << 5;
      local_24d8 = (ulong)(auVar24._0_4_ < 0.0) << 5 | 0x40;
      local_24e0 = (ulong)(auVar26._0_4_ < 0.0) << 5 | 0x80;
      local_24e8 = local_24d0 ^ 0x20;
      local_24f0 = local_24d8 ^ 0x20;
      local_24f8 = local_24e0 ^ 0x20;
      uVar37 = auVar6._0_4_;
      local_2418._4_4_ = uVar37;
      local_2418._0_4_ = uVar37;
      local_2418._8_4_ = uVar37;
      local_2418._12_4_ = uVar37;
      local_2418._16_4_ = uVar37;
      local_2418._20_4_ = uVar37;
      local_2418._24_4_ = uVar37;
      local_2418._28_4_ = uVar37;
      auVar48 = ZEXT3264(local_2418);
      uVar37 = auVar7._0_4_;
      auVar36 = ZEXT3264(CONCAT428(uVar37,CONCAT424(uVar37,CONCAT420(uVar37,CONCAT416(uVar37,
                                                  CONCAT412(uVar37,CONCAT48(uVar37,CONCAT44(uVar37,
                                                  uVar37))))))));
      local_2438._0_8_ = CONCAT44(fVar41,fVar41) ^ 0x8000000080000000;
      local_2438._8_4_ = -fVar41;
      local_2438._12_4_ = -fVar41;
      local_2438._16_4_ = -fVar41;
      local_2438._20_4_ = -fVar41;
      local_2438._24_4_ = -fVar41;
      local_2438._28_4_ = -fVar41;
      auVar43 = ZEXT3264(local_2438);
      local_2458._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
      local_2458._8_4_ = auVar27._8_4_ ^ 0x80000000;
      local_2458._12_4_ = auVar27._12_4_ ^ 0x80000000;
      local_2458._16_4_ = auVar27._16_4_ ^ 0x80000000;
      local_2458._20_4_ = auVar27._20_4_ ^ 0x80000000;
      local_2458._24_4_ = auVar27._24_4_ ^ 0x80000000;
      local_2458._28_4_ = auVar27._28_4_ ^ 0x80000000;
      auVar44 = ZEXT3264(local_2458);
      local_2478._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
      local_2478._8_4_ = auVar40._8_4_ ^ 0x80000000;
      local_2478._12_4_ = auVar40._12_4_ ^ 0x80000000;
      local_2478._16_4_ = auVar40._16_4_ ^ 0x80000000;
      local_2478._20_4_ = auVar40._20_4_ ^ 0x80000000;
      local_2478._24_4_ = auVar40._24_4_ ^ 0x80000000;
      local_2478._28_4_ = auVar40._28_4_ ^ 0x80000000;
      auVar49 = ZEXT3264(local_2478);
      auVar27 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
      auVar50 = ZEXT3264(auVar27);
      auVar27 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
      auVar51 = ZEXT3264(auVar27);
      uVar16 = local_24d0;
      uVar17 = local_24d8;
      uVar18 = local_24e0;
      uVar19 = local_24e8;
      uVar20 = local_24f0;
      uVar21 = local_24f8;
      local_2500 = context;
      do {
        do {
          if (local_24c8 == &local_2378) {
            return;
          }
          pfVar1 = (float *)(local_24c8 + -1);
          local_24c8 = local_24c8 + -2;
        } while ((ray->super_RayK<1>).tfar < *pfVar1);
        uVar23 = *local_24c8;
        do {
          auVar42 = auVar49._0_32_;
          auVar40 = auVar44._0_32_;
          auVar27 = auVar43._0_32_;
          if ((uVar23 & 8) == 0) {
            uVar13 = uVar23 & 0xfffffffffffffff0;
            uVar37 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
            auVar29._4_4_ = uVar37;
            auVar29._0_4_ = uVar37;
            auVar29._8_4_ = uVar37;
            auVar29._12_4_ = uVar37;
            auVar29._16_4_ = uVar37;
            auVar29._20_4_ = uVar37;
            auVar29._24_4_ = uVar37;
            auVar29._28_4_ = uVar37;
            auVar6 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + uVar16),auVar29,
                                     *(undefined1 (*) [32])(uVar13 + 0x40 + uVar16));
            auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar45._0_32_,auVar27);
            auVar31 = vmaxps_avx(auVar48._0_32_,ZEXT1632(auVar6));
            auVar6 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + uVar17),auVar29,
                                     *(undefined1 (*) [32])(uVar13 + 0x40 + uVar17));
            auVar7 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + uVar18),auVar29,
                                     *(undefined1 (*) [32])(uVar13 + 0x40 + uVar18));
            auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar46._0_32_,auVar40);
            auVar7 = vfmadd213ps_fma(ZEXT1632(auVar7),auVar47._0_32_,auVar42);
            auVar5 = vmaxps_avx(ZEXT1632(auVar6),ZEXT1632(auVar7));
            auVar28 = vmaxps_avx512vl(auVar31,auVar5);
            in_ZMM18 = ZEXT3264(auVar28);
            auVar6 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + uVar19),auVar29,
                                     *(undefined1 (*) [32])(uVar13 + 0x40 + uVar19));
            auVar7 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + uVar20),auVar29,
                                     *(undefined1 (*) [32])(uVar13 + 0x40 + uVar20));
            auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar45._0_32_,auVar27);
            auVar7 = vfmadd213ps_fma(ZEXT1632(auVar7),auVar46._0_32_,auVar40);
            auVar24 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + uVar21),auVar29,
                                      *(undefined1 (*) [32])(uVar13 + 0x40 + uVar21));
            auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar47._0_32_,auVar42);
            auVar31 = vminps_avx(ZEXT1632(auVar7),ZEXT1632(auVar24));
            auVar5 = vminps_avx(auVar36._0_32_,ZEXT1632(auVar6));
            auVar31 = vminps_avx(auVar5,auVar31);
            if (((uint)uVar23 & 7) == 6) {
              uVar38 = vcmpps_avx512vl(auVar28,auVar31,2);
              uVar10 = vcmpps_avx512vl(auVar29,*(undefined1 (*) [32])(uVar13 + 0x1c0),0xd);
              uVar11 = vcmpps_avx512vl(auVar29,*(undefined1 (*) [32])(uVar13 + 0x1e0),1);
              bVar22 = (byte)uVar38 & (byte)uVar10 & (byte)uVar11;
            }
            else {
              uVar38 = vcmpps_avx512vl(auVar28,auVar31,2);
              bVar22 = (byte)uVar38;
            }
            unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),(uint)bVar22);
          }
          if ((uVar23 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar12 = 4;
            }
            else {
              auVar31 = *(undefined1 (*) [32])(uVar23 & 0xfffffffffffffff0);
              auVar5 = ((undefined1 (*) [32])(uVar23 & 0xfffffffffffffff0))[1];
              auVar28 = vmovdqa64_avx512vl(auVar50._0_32_);
              auVar34 = in_ZMM18._0_32_;
              auVar28 = vpternlogd_avx512vl(auVar28,auVar34,auVar51._0_32_,0xf8);
              uVar23 = unaff_R12 & 0xffffffff;
              auVar29 = vpcompressd_avx512vl(auVar28);
              bVar4 = (bool)((byte)uVar23 & 1);
              auVar33._0_4_ = (uint)bVar4 * auVar29._0_4_ | (uint)!bVar4 * auVar28._0_4_;
              bVar4 = (bool)((byte)(uVar23 >> 1) & 1);
              auVar33._4_4_ = (uint)bVar4 * auVar29._4_4_ | (uint)!bVar4 * auVar28._4_4_;
              bVar4 = (bool)((byte)(uVar23 >> 2) & 1);
              auVar33._8_4_ = (uint)bVar4 * auVar29._8_4_ | (uint)!bVar4 * auVar28._8_4_;
              bVar4 = (bool)((byte)(uVar23 >> 3) & 1);
              auVar33._12_4_ = (uint)bVar4 * auVar29._12_4_ | (uint)!bVar4 * auVar28._12_4_;
              bVar4 = (bool)((byte)(uVar23 >> 4) & 1);
              auVar33._16_4_ = (uint)bVar4 * auVar29._16_4_ | (uint)!bVar4 * auVar28._16_4_;
              bVar4 = (bool)((byte)(uVar23 >> 5) & 1);
              auVar33._20_4_ = (uint)bVar4 * auVar29._20_4_ | (uint)!bVar4 * auVar28._20_4_;
              bVar4 = (bool)((byte)(uVar23 >> 6) & 1);
              auVar33._24_4_ = (uint)bVar4 * auVar29._24_4_ | (uint)!bVar4 * auVar28._24_4_;
              bVar4 = (bool)((byte)(uVar23 >> 7) & 1);
              auVar33._28_4_ = (uint)bVar4 * auVar29._28_4_ | (uint)!bVar4 * auVar28._28_4_;
              auVar28 = vpermt2q_avx512vl(auVar31,auVar33,auVar5);
              uVar23 = auVar28._0_8_;
              iVar12 = 0;
              uVar13 = unaff_R12 - 1 & unaff_R12;
              if (uVar13 != 0) {
                auVar28 = vpshufd_avx2(auVar33,0x55);
                vpermt2q_avx512vl(auVar31,auVar28,auVar5);
                auVar29 = vpminsd_avx2(auVar33,auVar28);
                auVar28 = vpmaxsd_avx2(auVar33,auVar28);
                uVar13 = uVar13 - 1 & uVar13;
                if (uVar13 == 0) {
                  auVar27 = vpermi2q_avx512vl(auVar29,auVar31,auVar5);
                  uVar23 = auVar27._0_8_;
                  auVar27 = vpermt2q_avx512vl(auVar31,auVar28,auVar5);
                  *local_24c8 = auVar27._0_8_;
                  auVar27 = vpermd_avx512vl(auVar28,auVar34);
                  *(int *)(local_24c8 + 1) = auVar27._0_4_;
                  local_24c8 = local_24c8 + 2;
                }
                else {
                  auVar9 = vpshufd_avx2(auVar33,0xaa);
                  vpermt2q_avx512vl(auVar31,auVar9,auVar5);
                  auVar8 = vpminsd_avx2(auVar29,auVar9);
                  auVar29 = vpmaxsd_avx2(auVar29,auVar9);
                  auVar9 = vpminsd_avx2(auVar28,auVar29);
                  auVar28 = vpmaxsd_avx2(auVar28,auVar29);
                  uVar13 = uVar13 - 1 & uVar13;
                  if (uVar13 == 0) {
                    auVar27 = vpermi2q_avx512vl(auVar8,auVar31,auVar5);
                    uVar23 = auVar27._0_8_;
                    auVar27 = vpermt2q_avx512vl(auVar31,auVar28,auVar5);
                    *local_24c8 = auVar27._0_8_;
                    auVar27 = vpermd_avx512vl(auVar28,auVar34);
                    *(int *)(local_24c8 + 1) = auVar27._0_4_;
                    auVar27 = vpermt2q_avx512vl(auVar31,auVar9,auVar5);
                    local_24c8[2] = auVar27._0_8_;
                    auVar27 = vpermd_avx512vl(auVar9,auVar34);
                    *(int *)(local_24c8 + 3) = auVar27._0_4_;
                    local_24c8 = local_24c8 + 4;
                  }
                  else {
                    auVar30 = vmovdqa64_avx512vl(auVar34);
                    auVar29 = vpshufd_avx2(auVar33,0xff);
                    vpermt2q_avx512vl(auVar31,auVar29,auVar5);
                    auVar34 = vpminsd_avx2(auVar8,auVar29);
                    auVar29 = vpmaxsd_avx2(auVar8,auVar29);
                    auVar8 = vpminsd_avx2(auVar9,auVar29);
                    auVar29 = vpmaxsd_avx2(auVar9,auVar29);
                    auVar9 = vpminsd_avx2(auVar28,auVar29);
                    auVar28 = vpmaxsd_avx2(auVar28,auVar29);
                    uVar13 = uVar13 - 1 & uVar13;
                    iVar12 = 0;
                    if (uVar13 == 0) {
                      auVar29 = vpermi2q_avx512vl(auVar34,auVar31,auVar5);
                      uVar23 = auVar29._0_8_;
                      auVar29 = vpermt2q_avx512vl(auVar31,auVar28,auVar5);
                      *local_24c8 = auVar29._0_8_;
                      auVar29 = vmovdqa64_avx512vl(auVar30);
                      in_ZMM18 = ZEXT3264(auVar29);
                      auVar28 = vpermd_avx512vl(auVar28,auVar30);
                      *(int *)(local_24c8 + 1) = auVar28._0_4_;
                      auVar28 = vpermt2q_avx512vl(auVar31,auVar9,auVar5);
                      local_24c8[2] = auVar28._0_8_;
                      auVar28 = vpermd_avx512vl(auVar9,auVar30);
                      *(int *)(local_24c8 + 3) = auVar28._0_4_;
                      auVar31 = vpermt2q_avx512vl(auVar31,auVar8,auVar5);
                      local_24c8[4] = auVar31._0_8_;
                      auVar31 = vpermd_avx512vl(auVar8,auVar30);
                      *(int *)(local_24c8 + 5) = auVar31._0_4_;
                      local_24c8 = local_24c8 + 6;
                      auVar43 = ZEXT3264(auVar27);
                      auVar44 = ZEXT3264(auVar40);
                      auVar49 = ZEXT3264(auVar42);
                    }
                    else {
                      auVar32 = valignd_avx512vl(auVar33,auVar33,3);
                      auVar29 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                      auVar33 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                     CONCAT48(0x80000000,
                                                                              0x8000000080000000))),
                                                  auVar29,auVar34);
                      auVar29 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                      auVar33 = vpermt2d_avx512vl(auVar33,auVar29,auVar8);
                      auVar33 = vpermt2d_avx512vl(auVar33,auVar29,auVar9);
                      auVar29 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                      auVar28 = vpermt2d_avx512vl(auVar33,auVar29,auVar28);
                      auVar43 = ZEXT3264(auVar28);
                      uVar23 = uVar13;
                      do {
                        auVar29 = auVar43._0_32_;
                        auVar28._8_4_ = 1;
                        auVar28._0_8_ = 0x100000001;
                        auVar28._12_4_ = 1;
                        auVar28._16_4_ = 1;
                        auVar28._20_4_ = 1;
                        auVar28._24_4_ = 1;
                        auVar28._28_4_ = 1;
                        auVar28 = vpermd_avx2(auVar28,auVar32);
                        auVar32 = valignd_avx512vl(auVar32,auVar32,1);
                        vpermt2q_avx512vl(auVar31,auVar32,auVar5);
                        uVar23 = uVar23 - 1 & uVar23;
                        uVar38 = vpcmpd_avx512vl(auVar28,auVar29,5);
                        auVar28 = vpmaxsd_avx2(auVar28,auVar29);
                        bVar22 = (byte)uVar38 << 1;
                        auVar29 = valignd_avx512vl(auVar29,auVar29,7);
                        bVar4 = (bool)((byte)uVar38 & 1);
                        auVar34._4_4_ = (uint)bVar4 * auVar29._4_4_ | (uint)!bVar4 * auVar28._4_4_;
                        auVar34._0_4_ = auVar28._0_4_;
                        bVar4 = (bool)(bVar22 >> 2 & 1);
                        auVar34._8_4_ = (uint)bVar4 * auVar29._8_4_ | (uint)!bVar4 * auVar28._8_4_;
                        bVar4 = (bool)(bVar22 >> 3 & 1);
                        auVar34._12_4_ =
                             (uint)bVar4 * auVar29._12_4_ | (uint)!bVar4 * auVar28._12_4_;
                        bVar4 = (bool)(bVar22 >> 4 & 1);
                        auVar34._16_4_ =
                             (uint)bVar4 * auVar29._16_4_ | (uint)!bVar4 * auVar28._16_4_;
                        bVar4 = (bool)(bVar22 >> 5 & 1);
                        auVar34._20_4_ =
                             (uint)bVar4 * auVar29._20_4_ | (uint)!bVar4 * auVar28._20_4_;
                        bVar4 = (bool)(bVar22 >> 6 & 1);
                        auVar34._24_4_ =
                             (uint)bVar4 * auVar29._24_4_ | (uint)!bVar4 * auVar28._24_4_;
                        auVar34._28_4_ =
                             (uint)(bVar22 >> 7) * auVar29._28_4_ |
                             (uint)!(bool)(bVar22 >> 7) * auVar28._28_4_;
                        auVar43 = ZEXT3264(auVar34);
                      } while (uVar23 != 0);
                      lVar15 = POPCOUNT(uVar13) + 3;
                      do {
                        auVar28 = vpermi2q_avx512vl(auVar34,auVar31,auVar5);
                        *local_24c8 = auVar28._0_8_;
                        auVar29 = auVar43._0_32_;
                        auVar28 = vpermd_avx512vl(auVar29,auVar30);
                        *(int *)(local_24c8 + 1) = auVar28._0_4_;
                        auVar34 = valignd_avx512vl(auVar29,auVar29,1);
                        local_24c8 = local_24c8 + 2;
                        auVar43 = ZEXT3264(auVar34);
                        lVar15 = lVar15 + -1;
                      } while (lVar15 != 0);
                      auVar31 = vpermt2q_avx512vl(auVar31,auVar34,auVar5);
                      uVar23 = auVar31._0_8_;
                      auVar43 = ZEXT3264(auVar27);
                      auVar44 = ZEXT3264(auVar40);
                      auVar49 = ZEXT3264(auVar42);
                      auVar27 = vmovdqa64_avx512vl(auVar30);
                      in_ZMM18 = ZEXT3264(auVar27);
                    }
                  }
                }
              }
            }
          }
          else {
            iVar12 = 6;
          }
        } while (iVar12 == 0);
        if (iVar12 == 6) {
          uVar16 = (ulong)((uint)uVar23 & 0xf);
          if (uVar16 != 8) {
            pSVar3 = local_2500->scene;
            lVar15 = 0;
            local_2398 = vmovdqu64_avx512vl(in_ZMM18._0_32_);
            do {
              local_24c0.geomID = *(uint *)((uVar23 & 0xfffffffffffffff0) + lVar15 * 8);
              local_2490 = (pSVar3->geometries).items[local_24c0.geomID].ptr;
              if (((ray->super_RayK<1>).mask & local_2490->mask) != 0) {
                local_24c0.primID = *(uint *)((uVar23 & 0xfffffffffffffff0) + 4 + lVar15 * 8);
                local_2504 = -1;
                local_24c0.valid = &local_2504;
                local_24c0.geometryUserPtr = local_2490->userPtr;
                local_24c0.context = local_2500->user;
                local_24c0.N = 1;
                local_2488 = 0;
                local_2480 = local_2500->args;
                pp_Var14 = (_func_int **)local_2480->intersect;
                if (pp_Var14 == (_func_int **)0x0) {
                  pp_Var14 = local_2490[1].super_RefCount._vptr_RefCount;
                }
                local_24c0.rayhit = (RTCRayHitN *)ray;
                (*(code *)pp_Var14)(&local_24c0);
                auVar45 = ZEXT3264(local_23b8);
                auVar46 = ZEXT3264(local_23d8);
                auVar47 = ZEXT3264(local_23f8);
                auVar48 = ZEXT3264(local_2418);
                auVar43 = ZEXT3264(local_2438);
                auVar44 = ZEXT3264(local_2458);
                auVar49 = ZEXT3264(local_2478);
                auVar27 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                auVar50 = ZEXT3264(auVar27);
                auVar27 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                auVar51 = ZEXT3264(auVar27);
                auVar27 = vmovdqu64_avx512vl(local_2398);
                in_ZMM18 = ZEXT3264(auVar27);
              }
              lVar15 = lVar15 + 1;
            } while (uVar16 - 8 != lVar15);
          }
          fVar35 = (ray->super_RayK<1>).tfar;
          auVar36 = ZEXT3264(CONCAT428(fVar35,CONCAT424(fVar35,CONCAT420(fVar35,CONCAT416(fVar35,
                                                  CONCAT412(fVar35,CONCAT48(fVar35,CONCAT44(fVar35,
                                                  fVar35))))))));
          uVar16 = local_24d0;
          uVar17 = local_24d8;
          uVar18 = local_24e0;
          uVar19 = local_24e8;
          uVar20 = local_24f0;
          uVar21 = local_24f8;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }